

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compliance.cpp
# Opt level: O0

void anon_unknown.dwarf_d465::test_compliance
               (uint8_t *compressed_bytes,size_t compressed_length,uint8_t *uncompressed_data,
               size_t uncompressed_length,bool check_encode)

{
  value_type vVar1;
  bool condition;
  int32_t iVar2;
  jpegls_decoder *this;
  const_reference pvVar3;
  jpegls_error *anon_var_0;
  size_t i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> destination;
  undefined1 local_c0 [8];
  jpegls_decoder decoder;
  bool check_encode_local;
  size_t uncompressed_length_local;
  uint8_t *uncompressed_data_local;
  size_t compressed_length_local;
  uint8_t *compressed_bytes_local;
  
  decoder.application_data_handler_._M_invoker._7_1_ = check_encode;
  charls::jpegls_decoder::jpegls_decoder((jpegls_decoder *)local_c0);
  this = charls::jpegls_decoder::source
                   ((jpegls_decoder *)local_c0,compressed_bytes,compressed_length);
  charls::jpegls_decoder::read_header(this);
  if ((decoder.application_data_handler_._M_invoker._7_1_ & 1) != 0) {
    condition = verify_encoded_bytes
                          (uncompressed_data,uncompressed_length,compressed_bytes,compressed_length)
    ;
    assert::is_true(condition);
  }
  charls::jpegls_decoder::
  decode<std::vector<unsigned_char,std::allocator<unsigned_char>>,unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,(jpegls_decoder *)local_c0,
             0);
  iVar2 = charls::jpegls_decoder::near_lossless((jpegls_decoder *)local_c0,0);
  if (iVar2 == 0) {
    for (anon_var_0 = (jpegls_error *)0x0; anon_var_0 != (jpegls_error *)uncompressed_length;
        anon_var_0 = (jpegls_error *)&anon_var_0->field_0x1) {
      vVar1 = uncompressed_data[(long)anon_var_0];
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                          (size_type)anon_var_0);
      if (vVar1 != *pvVar3) {
        assert::is_true(false);
        break;
      }
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
  charls::jpegls_decoder::~jpegls_decoder((jpegls_decoder *)local_c0);
  return;
}

Assistant:

void test_compliance(const uint8_t* compressed_bytes, const size_t compressed_length, const uint8_t* uncompressed_data,
                     const size_t uncompressed_length, const bool check_encode)
{
    try
    {
        jpegls_decoder decoder;
        decoder.source(compressed_bytes, compressed_length).read_header();

        if (check_encode)
        {
            assert::is_true(
                verify_encoded_bytes(uncompressed_data, uncompressed_length, compressed_bytes, compressed_length));
        }

        const auto destination{decoder.decode<vector<uint8_t>>()};

        if (decoder.near_lossless() == 0)
        {
            for (size_t i{}; i != uncompressed_length; ++i)
            {
                if (uncompressed_data[i] != destination[i])
                {
                    assert::is_true(false);
                    break;
                }
            }
        }
    }
    catch (const jpegls_error&)
    {
        assert::is_true(false);
    }
}